

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Errors::RBDLDofMismatchError::~RBDLDofMismatchError(RBDLDofMismatchError *this)

{
  void *in_RDI;
  
  ~RBDLDofMismatchError((RBDLDofMismatchError *)0x6da568);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLDofMismatchError : public RBDLError
{
public:
  RBDLDofMismatchError(std::string text);
}